

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_2.cpp
# Opt level: O2

int evaluate(int a,int b,char op)

{
  ostream *poVar1;
  undefined7 in_register_00000011;
  int iVar2;
  
  switch((int)CONCAT71(in_register_00000011,op)) {
  case 0x2a:
    iVar2 = b * a;
    break;
  case 0x2b:
    iVar2 = b + a;
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"Oh noez! I do not know this operator. ");
    poVar1 = std::operator<<(poVar1,op);
    std::operator<<(poVar1,'\n');
    goto LAB_00101355;
  case 0x2d:
    iVar2 = a - b;
    break;
  case 0x2f:
    if (b != 0) {
      return a / b;
    }
    std::operator<<((ostream *)&std::cerr,"Oh, you cannot device by 0\n");
LAB_00101355:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int evaluate(int a, int b, char op)
{
	switch (op)
	{
		case '+':
			return a + b;
		case '-':
			return a - b;
		case '*':
			return a * b;
		case '/':
			if (b != 0)
				return a / b;
			cerr << "Oh, you cannot device by 0\n";
			break;
		default:
			cerr << "Oh noez! I do not know this operator. " << op << '\n';
			break;
	}
	return 0; // failure case
}